

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

csubstr __thiscall c4::yml::Parser::_scan_dquot_scalar(Parser *this)

{
  State *pSVar1;
  ulong ahead;
  code *pcVar2;
  Location LVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  Location LVar9;
  Location LVar10;
  Location LVar11;
  bool bVar12;
  uint uVar13;
  bool bVar14;
  bool bVar15;
  long lVar16;
  char *pcVar17;
  basic_substring<char> *pbVar18;
  ulong uVar19;
  char cVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  byte bVar25;
  csubstr cVar26;
  basic_substring<char> bVar27;
  char msg [41];
  basic_substring<char> local_1f8;
  basic_substring<char> local_1e8;
  char local_1d8 [48];
  undefined4 local_1a8;
  undefined1 local_1a4;
  size_t local_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  char *pcStack_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  char *pcStack_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  char *pcStack_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  char *pcStack_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  char *pcStack_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  char *pcStack_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  char *pcStack_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  char *pcStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  bVar25 = 0;
  uVar22 = (this->m_state->pos).super_LineCol.offset;
  if ((this->m_buf).len < uVar22) {
    if (((s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
      pcVar2 = (code *)swi(3);
      cVar26 = (csubstr)(*pcVar2)();
      return cVar26;
    }
    handle_error(0x21a325,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x1533,"first >= 0 && first <= len");
  }
  basic_substring<char>::basic_substring
            (&local_1e8,(this->m_buf).str + uVar22,(this->m_buf).len - uVar22);
  local_1f8 = local_1e8;
  if ((local_1e8.len != 0) && (*local_1e8.str == ' ')) {
    local_1f8 = basic_substring<char>::triml(&local_1f8,' ');
    if ((this->m_buf).len < uVar22) {
      if (((s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
        pcVar2 = (code *)swi(3);
        cVar26 = (csubstr)(*pcVar2)();
        return cVar26;
      }
      handle_error(0x21a325,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1533,"first >= 0 && first <= len");
    }
    basic_substring<char>::basic_substring
              (&local_1e8,(this->m_buf).str + uVar22,(this->m_buf).len - uVar22);
    if (local_1e8.len == 0) {
      if (local_1f8.len == 0) {
        bVar14 = local_1e8.str != (char *)0x0 && local_1e8.str == local_1f8.str;
        goto LAB_001eb717;
      }
LAB_001eb71f:
      builtin_strncpy(local_1d8,"_buf.sub(b).is_super(s))",0x19);
      local_1e8.len._0_1_ = 'i';
      local_1e8.len._1_1_ = 'l';
      local_1e8.len._2_1_ = 'e';
      local_1e8.len._3_1_ = 'd';
      local_1e8.len._4_1_ = ':';
      local_1e8.len._5_1_ = ' ';
      local_1e8.len._6_1_ = '(';
      local_1e8.len._7_1_ = 'm';
      local_1e8.str = (char *)0x6166206b63656863;
      if (((s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
        pcVar2 = (code *)swi(3);
        cVar26 = (csubstr)(*pcVar2)();
        return cVar26;
      }
      local_58 = 0;
      uStack_50 = 0x7a7c;
      local_48 = 0;
      pcStack_40 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_38 = 0x65;
      LVar3.super_LineCol.col = 0;
      LVar3.super_LineCol.offset = SUB168(ZEXT816(0x7a7c) << 0x40,0);
      LVar3.super_LineCol.line = SUB168(ZEXT816(0x7a7c) << 0x40,8);
      LVar3.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar3.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                ((char *)&local_1e8,0x29,LVar3,(this->m_stack).m_callbacks.m_user_data);
    }
    else {
      bVar14 = local_1f8.str + local_1f8.len <= local_1e8.str + local_1e8.len &&
               local_1e8.str <= local_1f8.str;
LAB_001eb717:
      if (!bVar14) goto LAB_001eb71f;
    }
    pcVar17 = local_1f8.str;
    if ((this->m_buf).len < uVar22) {
      if (((s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
        pcVar2 = (code *)swi(3);
        cVar26 = (csubstr)(*pcVar2)();
        return cVar26;
      }
      handle_error(0x21a325,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1533,"first >= 0 && first <= len");
    }
    basic_substring<char>::basic_substring
              (&local_1e8,(this->m_buf).str + uVar22,(this->m_buf).len - uVar22);
    if (pcVar17 < local_1e8.str) {
      builtin_strncpy(local_1d8,".begin() >= m_buf.sub(b).begin())",0x22);
      local_1e8.len._0_1_ = 'i';
      local_1e8.len._1_1_ = 'l';
      local_1e8.len._2_1_ = 'e';
      local_1e8.len._3_1_ = 'd';
      local_1e8.len._4_1_ = ':';
      local_1e8.len._5_1_ = ' ';
      local_1e8.len._6_1_ = '(';
      local_1e8.len._7_1_ = 's';
      local_1e8.str = (char *)0x6166206b63656863;
      if (((s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
        pcVar2 = (code *)swi(3);
        cVar26 = (csubstr)(*pcVar2)();
        return cVar26;
      }
      local_80 = 0;
      uStack_78 = 0x7a7d;
      local_70 = 0;
      pcStack_68 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_60 = 0x65;
      LVar4.super_LineCol.col = 0;
      LVar4.super_LineCol.offset = SUB168(ZEXT816(0x7a7d) << 0x40,0);
      LVar4.super_LineCol.line = SUB168(ZEXT816(0x7a7d) << 0x40,8);
      LVar4.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar4.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                ((char *)&local_1e8,0x32,LVar4,(this->m_stack).m_callbacks.m_user_data);
    }
    pcVar17 = local_1f8.str;
    if ((this->m_buf).len < uVar22) {
      if (((s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
        pcVar2 = (code *)swi(3);
        cVar26 = (csubstr)(*pcVar2)();
        return cVar26;
      }
      handle_error(0x21a325,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1533,"first >= 0 && first <= len");
    }
    basic_substring<char>::basic_substring
              (&local_1e8,(this->m_buf).str + uVar22,(this->m_buf).len - uVar22);
    _line_progressed(this,(long)pcVar17 - (long)local_1e8.str);
  }
  local_1a0 = (this->m_state->pos).super_LineCol.offset;
  if ((local_1f8.len == 0) || (*local_1f8.str != '\"')) {
    builtin_strncpy(local_1d8,".begins_with(\'\"\'))",0x13);
    local_1e8.len._0_1_ = 'i';
    local_1e8.len._1_1_ = 'l';
    local_1e8.len._2_1_ = 'e';
    local_1e8.len._3_1_ = 'd';
    local_1e8.len._4_1_ = ':';
    local_1e8.len._5_1_ = ' ';
    local_1e8.len._6_1_ = '(';
    local_1e8.len._7_1_ = 's';
    local_1e8.str = (char *)0x6166206b63656863;
    if (((s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
      pcVar2 = (code *)swi(3);
      cVar26 = (csubstr)(*pcVar2)();
      return cVar26;
    }
    local_a8 = 0;
    uStack_a0 = 0x7a81;
    local_98 = 0;
    pcStack_90 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_88 = 0x65;
    LVar5.super_LineCol.col = 0;
    LVar5.super_LineCol.offset = SUB168(ZEXT816(0x7a81) << 0x40,0);
    LVar5.super_LineCol.line = SUB168(ZEXT816(0x7a81) << 0x40,8);
    LVar5.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar5.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_1e8,0x23,LVar5,(this->m_stack).m_callbacks.m_user_data);
  }
  _line_progressed(this,1);
  if (local_1f8.len == 0) {
    if (((s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
      pcVar2 = (code *)swi(3);
      cVar26 = (csubstr)(*pcVar2)();
      return cVar26;
    }
    handle_error(0x21a325,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x1533,"first >= 0 && first <= len");
  }
  basic_substring<char>::basic_substring(&local_1e8,local_1f8.str + 1,local_1f8.len - 1);
  local_1f8 = local_1e8;
  local_1a0 = ~local_1a0;
  uVar21 = 1;
  uVar22 = 0xffffffffffffffff;
  bVar14 = false;
  do {
    pSVar1 = this->m_state;
    uVar24 = (this->m_buf).len;
    if (uVar24 <= (pSVar1->pos).super_LineCol.offset) break;
    pcVar17 = (pSVar1->line_contents).rem.str;
    ahead = (pSVar1->line_contents).rem.len;
    bVar15 = true;
    uVar23 = uVar22;
    if (ahead != 0) {
      uVar19 = 0;
      do {
        cVar20 = pcVar17[uVar19];
        bVar12 = false;
        if (cVar20 != ' ') {
          bVar15 = bVar12;
        }
        uVar23 = uVar19;
        if (cVar20 != '\"') {
          uVar23 = uVar22;
          if (cVar20 == '\\') {
            uVar22 = uVar19 + 1;
            cVar20 = '~';
            if (uVar22 < ahead) {
              cVar20 = pcVar17[uVar22];
            }
            if ((cVar20 != '\\') && (cVar20 != '\"')) {
              uVar22 = uVar19;
            }
            bVar12 = true;
            bVar14 = true;
            uVar19 = uVar22;
          }
          else {
            bVar12 = true;
          }
        }
      } while ((bVar12) && (uVar19 = uVar19 + 1, uVar22 = uVar23, uVar19 < ahead));
    }
    if ((bVar14) || (1 < uVar21)) {
      bVar14 = true;
    }
    else {
      bVar14 = true;
      if (((!bVar15) && (bVar14 = false, ahead != 0)) &&
         (pcVar17 == (pSVar1->line_contents).full.str)) {
        bVar14 = *pcVar17 == ' ';
      }
    }
    if (uVar23 == 0xffffffffffffffff) {
      _line_progressed(this,ahead);
      uVar21 = uVar21 + 1;
      _line_ended(this);
      _scan_line(this);
      uVar22 = 0xffffffffffffffff;
    }
    else {
      if (uVar24 <= uVar23) {
        builtin_strncpy(local_1d8,"os >= 0 && pos < m_buf.len)",0x1c);
        local_1e8.len._0_1_ = 'i';
        local_1e8.len._1_1_ = 'l';
        local_1e8.len._2_1_ = 'e';
        local_1e8.len._3_1_ = 'd';
        local_1e8.len._4_1_ = ':';
        local_1e8.len._5_1_ = ' ';
        local_1e8.len._6_1_ = '(';
        local_1e8.len._7_1_ = 'p';
        local_1e8.str = (char *)0x6166206b63656863;
        if (((s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
          pcVar2 = (code *)swi(3);
          cVar26 = (csubstr)(*pcVar2)();
          return cVar26;
        }
        local_d0 = 0;
        uStack_c8 = 0x7ab1;
        local_c0 = 0;
        pcStack_b8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_b0 = 0x65;
        LVar6.super_LineCol.col = 0;
        LVar6.super_LineCol.offset = SUB168(ZEXT816(0x7ab1) << 0x40,0);
        LVar6.super_LineCol.line = SUB168(ZEXT816(0x7ab1) << 0x40,8);
        LVar6.name.str =
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        LVar6.name.len = 0x65;
        (*(this->m_stack).m_callbacks.m_error)
                  ((char *)&local_1e8,0x2c,LVar6,(this->m_stack).m_callbacks.m_user_data);
      }
      uVar22 = (this->m_state->pos).super_LineCol.offset + uVar23;
      if ((this->m_buf).len <= uVar22) {
        if (((s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
          pcVar2 = (code *)swi(3);
          cVar26 = (csubstr)(*pcVar2)();
          return cVar26;
        }
        handle_error(0x21a325,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x14c3,"i >= 0 && i < len");
      }
      if ((this->m_buf).str[uVar22] != '\"') {
        builtin_strncpy(local_1d8,"_buf[m_state->pos.offset + pos] == \'\"\')",0x28);
        local_1e8.len._0_1_ = 'i';
        local_1e8.len._1_1_ = 'l';
        local_1e8.len._2_1_ = 'e';
        local_1e8.len._3_1_ = 'd';
        local_1e8.len._4_1_ = ':';
        local_1e8.len._5_1_ = ' ';
        local_1e8.len._6_1_ = '(';
        local_1e8.len._7_1_ = 'm';
        local_1e8.str = (char *)0x6166206b63656863;
        if (((s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
          pcVar2 = (code *)swi(3);
          cVar26 = (csubstr)(*pcVar2)();
          return cVar26;
        }
        local_f8 = 0;
        uStack_f0 = 0x7ab2;
        local_e8 = 0;
        pcStack_e0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_d8 = 0x65;
        LVar7.super_LineCol.col = 0;
        LVar7.super_LineCol.offset = SUB168(ZEXT816(0x7ab2) << 0x40,0);
        LVar7.super_LineCol.line = SUB168(ZEXT816(0x7ab2) << 0x40,8);
        LVar7.name.str =
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        LVar7.name.len = 0x65;
        (*(this->m_stack).m_callbacks.m_error)
                  ((char *)&local_1e8,0x38,LVar7,(this->m_stack).m_callbacks.m_user_data);
      }
      _line_progressed(this,uVar23 + 1);
      uVar22 = (this->m_state->pos).super_LineCol.offset + local_1a0;
    }
  } while (uVar23 == 0xffffffffffffffff);
  if (uVar22 == 0) {
    local_1e8.len._0_1_ = 'i';
    local_1e8.len._1_1_ = 'l';
    local_1e8.len._2_1_ = 'e';
    local_1e8.len._3_1_ = 'd';
    local_1e8.len._4_1_ = ':';
    local_1e8.len._5_1_ = ' ';
    local_1e8.len._6_1_ = '(';
    local_1e8.len._7_1_ = 'p';
    local_1e8.str = (char *)0x6166206b63656863;
    builtin_strncpy(local_1d8,"os > 0)",8);
    if (((s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
      pcVar2 = (code *)swi(3);
      cVar26 = (csubstr)(*pcVar2)();
      return cVar26;
    }
    local_120 = 0;
    uStack_118 = 0x7ac2;
    local_110 = 0;
    pcStack_108 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_100 = 0x65;
    LVar8.super_LineCol.col = 0;
    LVar8.super_LineCol.offset = SUB168(ZEXT816(0x7ac2) << 0x40,0);
    LVar8.super_LineCol.line = SUB168(ZEXT816(0x7ac2) << 0x40,8);
    LVar8.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar8.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_1e8,0x18,LVar8,(this->m_stack).m_callbacks.m_user_data);
  }
  else if (uVar22 == 0xffffffffffffffff) {
    bVar15 = is_debugger_attached();
    if ((bVar15) && (bVar15 = is_debugger_attached(), bVar15)) {
      pcVar2 = (code *)swi(3);
      cVar26 = (csubstr)(*pcVar2)();
      return cVar26;
    }
    cVar26.len = 0x34;
    cVar26.str = "ERROR: reached end of file looking for closing quote";
    _err<>(this,cVar26);
    goto LAB_001ebffa;
  }
  if ((local_1f8.str + local_1f8.len != (this->m_buf).str + (this->m_buf).len) &&
     (local_1f8.str[local_1f8.len] != '\"')) {
    builtin_strncpy(local_1d8 + 0x20,") == \'\"\')",10);
    builtin_strncpy(local_1d8,".end() == m_buf.end() || *s.end(",0x20);
    local_1e8.len._0_1_ = 'i';
    local_1e8.len._1_1_ = 'l';
    local_1e8.len._2_1_ = 'e';
    local_1e8.len._3_1_ = 'd';
    local_1e8.len._4_1_ = ':';
    local_1e8.len._5_1_ = ' ';
    local_1e8.len._6_1_ = '(';
    local_1e8.len._7_1_ = 's';
    local_1e8.str = (char *)0x6166206b63656863;
    if (((s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
      pcVar2 = (code *)swi(3);
      cVar26 = (csubstr)(*pcVar2)();
      return cVar26;
    }
    local_148 = 0;
    uStack_140 = 0x7ac3;
    local_138 = 0;
    pcStack_130 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_128 = 0x65;
    LVar9.super_LineCol.col = 0;
    LVar9.super_LineCol.offset = SUB168(ZEXT816(0x7ac3) << 0x40,0);
    LVar9.super_LineCol.line = SUB168(ZEXT816(0x7ac3) << 0x40,8);
    LVar9.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar9.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_1e8,0x3a,LVar9,(this->m_stack).m_callbacks.m_user_data);
  }
  pcVar17 = (this->m_buf).str;
  if ((local_1f8.str + local_1f8.len < pcVar17) ||
     (pcVar17 + (this->m_buf).len < local_1f8.str + local_1f8.len)) {
    pcVar17 = "check failed: (s.end() >= m_buf.begin() && s.end() <= m_buf.end())";
    pbVar18 = &local_1e8;
    for (lVar16 = 8; lVar16 != 0; lVar16 = lVar16 + -1) {
      pbVar18->str = *(char **)pcVar17;
      pcVar17 = pcVar17 + ((ulong)bVar25 * -2 + 1) * 8;
      pbVar18 = (basic_substring<char> *)&pbVar18[-(ulong)bVar25].len;
    }
    uVar13 = (uint)local_1a8 >> 0x10;
    local_1a8 = CONCAT22((ushort)uVar13 & 0xff00,0x2929);
    if (((s_error_flags & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
      pcVar2 = (code *)swi(3);
      cVar26 = (csubstr)(*pcVar2)();
      return cVar26;
    }
    local_170 = 0;
    uStack_168 = 0x7ac4;
    local_160 = 0;
    pcStack_158 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_150 = 0x65;
    LVar10.super_LineCol.col = 0;
    LVar10.super_LineCol.offset = SUB168(ZEXT816(0x7ac4) << 0x40,0);
    LVar10.super_LineCol.line = SUB168(ZEXT816(0x7ac4) << 0x40,8);
    LVar10.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar10.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_1e8,0x43,LVar10,(this->m_stack).m_callbacks.m_user_data);
  }
  uVar21 = uVar22 - 1;
  if ((uVar22 != 0) && (local_1f8.len < uVar21)) {
    if (((s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
      pcVar2 = (code *)swi(3);
      cVar26 = (csubstr)(*pcVar2)();
      return cVar26;
    }
    handle_error(0x21a325,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x153b,"(num >= 0 && num <= len) || (num == npos)");
  }
  uVar24 = uVar21;
  if (uVar22 == 0) {
    uVar24 = local_1f8.len;
  }
  if (uVar21 != 0 && local_1f8.len < uVar24) {
    if (((s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
      pcVar2 = (code *)swi(3);
      cVar26 = (csubstr)(*pcVar2)();
      return cVar26;
    }
    handle_error(0x21a325,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x153d,"(first >= 0 && first + rnum <= len) || (num == 0)");
  }
  basic_substring<char>::basic_substring(&local_1e8,local_1f8.str,uVar24);
  local_1f8 = local_1e8;
LAB_001ebffa:
  cVar26 = (csubstr)local_1f8;
  if (bVar14) {
    cVar26 = _filter_dquot_scalar(this,local_1f8);
    if (((local_1f8.len < cVar26.len) && (local_1f8.len != 0)) && (local_1f8.str != (char *)0x0)) {
      local_1e8 = basic_substring<char>::triml(&local_1f8,' ');
      bVar27 = basic_substring<char>::trimr(&local_1e8,' ');
      if (bVar27.str != (char *)0x0 && bVar27.len != 0) {
        pcVar17 = "check failed: (ret.len <= s.len || s.empty() || s.trim(\' \').empty())";
        pbVar18 = &local_1e8;
        for (lVar16 = 8; lVar16 != 0; lVar16 = lVar16 + -1) {
          pbVar18->str = *(char **)pcVar17;
          pcVar17 = pcVar17 + ((ulong)bVar25 * -2 + 1) * 8;
          pbVar18 = (basic_substring<char> *)&pbVar18[-(ulong)bVar25].len;
        }
        local_1a4 = 0;
        local_1a8 = 0x29292879;
        if (((s_error_flags & 1) != 0) && (bVar14 = is_debugger_attached(), bVar14)) {
          pcVar2 = (code *)swi(3);
          cVar26 = (csubstr)(*pcVar2)();
          return cVar26;
        }
        local_198 = 0;
        uStack_190 = 0x7acc;
        local_188 = 0;
        pcStack_180 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_178 = 0x65;
        LVar11.super_LineCol.col = 0;
        LVar11.super_LineCol.offset = SUB168(ZEXT816(0x7acc) << 0x40,0);
        LVar11.super_LineCol.line = SUB168(ZEXT816(0x7acc) << 0x40,8);
        LVar11.name.str =
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        LVar11.name.len = 0x65;
        (*(this->m_stack).m_callbacks.m_error)
                  ((char *)&local_1e8,0x45,LVar11,(this->m_stack).m_callbacks.m_user_data);
      }
    }
  }
  return cVar26;
}

Assistant:

csubstr Parser::_scan_dquot_scalar()
{
    // quoted scalars can spread over multiple lines!
    // nice explanation here: http://yaml-multiline.info/

    // a span to the end of the file
    size_t b = m_state->pos.offset;
    substr s = m_buf.sub(b);
    if(s.begins_with(' '))
    {
        s = s.triml(' ');
        _RYML_CB_ASSERT(m_stack.m_callbacks, m_buf.sub(b).is_super(s));
        _RYML_CB_ASSERT(m_stack.m_callbacks, s.begin() >= m_buf.sub(b).begin());
        _line_progressed((size_t)(s.begin() - m_buf.sub(b).begin()));
    }
    b = m_state->pos.offset; // take this into account
    _RYML_CB_ASSERT(m_stack.m_callbacks, s.begins_with('"'));

    // skip the opening quote
    _line_progressed(1);
    s = s.sub(1);

    bool needs_filter = false;

    size_t numlines = 1; // we already have one line
    size_t pos = npos; // find the pos of the matching quote
    while( ! _finished_file())
    {
        const csubstr line = m_state->line_contents.rem;
        bool line_is_blank = true;
        _c4dbgpf("scanning double quoted scalar @ line[{}]:  line='{}'", m_state->pos.line, line);
        for(size_t i = 0; i < line.len; ++i)
        {
            const char curr = line.str[i];
            if(curr != ' ')
                line_is_blank = false;
            // every \ is an escape
            if(curr == '\\')
            {
                const char next = i+1 < line.len ? line.str[i+1] : '~';
                needs_filter = true;
                if(next == '"' || next == '\\')
                    ++i;
            }
            else if(curr == '"')
            {
                pos = i;
                break;
            }
        }

        // leading whitespace also needs filtering
        needs_filter = needs_filter
            || (numlines > 1)
            || line_is_blank
            || (_at_line_begin() && line.begins_with(' '));

        if(pos == npos)
        {
            _line_progressed(line.len);
            ++numlines;
        }
        else
        {
            _RYML_CB_ASSERT(m_stack.m_callbacks, pos >= 0 && pos < m_buf.len);
            _RYML_CB_ASSERT(m_stack.m_callbacks, m_buf[m_state->pos.offset + pos] == '"');
            _line_progressed(pos + 1); // progress beyond the quote
            pos = m_state->pos.offset - b - 1; // but we stop before it
            break;
        }

        _line_ended();
        _scan_line();
    }

    if(pos == npos)
    {
        _c4err("reached end of file looking for closing quote");
    }
    else
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, pos > 0);
        _RYML_CB_ASSERT(m_stack.m_callbacks, s.end() == m_buf.end() || *s.end() == '"');
        _RYML_CB_ASSERT(m_stack.m_callbacks, s.end() >= m_buf.begin() && s.end() <= m_buf.end());
        s = s.sub(0, pos-1);
    }

    if(needs_filter)
    {
        csubstr ret = _filter_dquot_scalar(s);
        _c4dbgpf("final scalar: [{}]\"{}\"", ret.len, ret);
        _RYML_CB_ASSERT(m_stack.m_callbacks, ret.len <= s.len || s.empty() || s.trim(' ').empty());
        return ret;
    }

    _c4dbgpf("final scalar: \"{}\"", s);

    return s;
}